

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::AppendIPOLinkerFlags
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *config,
          string *lang)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  bool bVar1;
  TargetType TVar2;
  string *psVar3;
  reference pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_130;
  string *o;
  iterator __end1;
  iterator __begin1;
  cmList *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  iterator local_b8;
  size_type local_b0;
  undefined1 local_a8 [8];
  cmList flagsList;
  cmValue local_88;
  cmValue rawFlagsList;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string name;
  string *lang_local;
  string *config_local;
  cmGeneratorTarget *target_local;
  string *flags_local;
  cmLocalGenerator *this_local;
  
  name.field_2._8_8_ = lang;
  bVar1 = cmGeneratorTarget::IsIPOEnabled(target,lang,config);
  if ((bVar1) &&
     ((TVar2 = cmGeneratorTarget::GetType(target), TVar2 == EXECUTABLE ||
      (TVar2 == SHARED_LIBRARY || TVar2 == MODULE_LIBRARY)))) {
    std::operator+(&local_70,"CMAKE_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   name.field_2._8_8_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   &local_70,"_LINK_OPTIONS_IPO");
    std::__cxx11::string::~string((string *)&local_70);
    local_88 = cmMakefile::GetDefinition(this->Makefile,(string *)local_50);
    bVar1 = cmValue::operator_cast_to_bool(&local_88);
    if (bVar1) {
      psVar3 = cmValue::operator*[abi_cxx11_(&local_88);
      std::__cxx11::string::string((string *)&local_d8,(string *)psVar3);
      local_b8 = &local_d8;
      local_b0 = 1;
      init._M_len = 1;
      init._M_array = local_b8;
      cmList::cmList((cmList *)local_a8,init);
      local_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8;
      do {
        local_130 = local_130 + -1;
        std::__cxx11::string::~string((string *)local_130);
      } while (local_130 != &local_d8);
      __end1 = cmList::begin_abi_cxx11_((cmList *)local_a8);
      o = (string *)cmList::end_abi_cxx11_((cmList *)local_a8);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&o), bVar1) {
        pbVar4 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end1);
        (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[9])(this,flags,pbVar4);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1);
      }
      cmList::~cmList((cmList *)local_a8);
      flagsList.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    }
    else {
      flagsList.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_50);
  }
  return;
}

Assistant:

void cmLocalGenerator::AppendIPOLinkerFlags(std::string& flags,
                                            cmGeneratorTarget* target,
                                            const std::string& config,
                                            const std::string& lang)
{
  if (!target->IsIPOEnabled(lang, config)) {
    return;
  }

  switch (target->GetType()) {
    case cmStateEnums::EXECUTABLE:
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
      break;
    default:
      return;
  }

  const std::string name = "CMAKE_" + lang + "_LINK_OPTIONS_IPO";
  cmValue rawFlagsList = this->Makefile->GetDefinition(name);
  if (!rawFlagsList) {
    return;
  }

  cmList flagsList{ *rawFlagsList };
  for (std::string const& o : flagsList) {
    this->AppendFlagEscape(flags, o);
  }
}